

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framebuffer.cpp
# Opt level: O1

void __thiscall image::Framebuffer::save_buffer(Framebuffer *this,string *name)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ofstream output;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)name,_S_trunc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P3",2);
  local_231 = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_width);
  local_231 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_231,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_height);
  local_231 = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_231,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0xff);
  local_231 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_231,1);
  if (0 < this->m_height) {
    lVar3 = 0;
    do {
      if (0 < this->m_width) {
        lVar4 = 0;
        lVar2 = 0;
        do {
          operator<<((ostream *)&local_230,(Color *)((long)&this->m_buffer[lVar3]->r + lVar4));
          lVar2 = lVar2 + 1;
          lVar4 = lVar4 + 0x18;
        } while (lVar2 < this->m_width);
      }
      local_231 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->m_height);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void image::Framebuffer::save_buffer(const std::string &name)
{
    std::ofstream output(name, std::ofstream::trunc);

    // standard P3 output
    output << "P3" << '\n' 
	   << m_width << ' ' << m_height << '\n' 
	   << 255 << '\n';
    for (int y = 0; y < m_height; y++)
    {
	for (int x = 0; x < m_width; x++)
	{
	    output << m_buffer[y][x];
	}
	output << '\n';
    }

    output.close();
}